

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
SelectGenericCommand::trigger(SelectGenericCommand *this,string_view parameters)

{
  bool bVar1;
  ResponseLine *pRVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  allocator<char> local_171;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_119;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  SelectGenericCommand *local_d8;
  size_t local_d0;
  undefined1 local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  SelectGenericCommand *local_28;
  SelectGenericCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (SelectGenericCommand *)parameters._M_len;
  local_28 = this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    if (IRCCommand::selected_server == 0) {
      pRVar2 = (ResponseLine *)operator_new(0x30);
      local_38 = sv("No IRC server is currently selected.",0x24);
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,local_38._M_len,local_38._M_str,0);
      parameters_local._M_str = (char *)pRVar2;
    }
    else {
      pRVar2 = (ResponseLine *)operator_new(0x30);
      local_c1 = 1;
      local_98 = (basic_string_view<char,_std::char_traits<char>_>)
                 Jupiter::IRC::Client::getConfigSection();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_88,&local_98,&local_99);
      s_abi_cxx11_(&local_c0," is currently selected.",0x17);
      std::operator+(&local_68,&local_88,&local_c0);
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_68,0);
      local_c1 = 0;
      parameters_local._M_str = (char *)pRVar2;
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  else {
    if (IRCCommand::active_server == IRCCommand::selected_server) {
      IRCCommand::active_server = 0;
    }
    local_d8 = this_local;
    local_d0 = parameters_local._M_len;
    IRCCommand::selected_server =
         ServerManager::getServer(_serverManager,this_local,parameters_local._M_len);
    if (IRCCommand::selected_server == 0) {
      pRVar2 = (ResponseLine *)operator_new(0x30);
      local_119 = 1;
      local_108 = sv("Error: IRC server \"",0x13);
      local_118 = sv("\" not found. No IRC server is currently selected.",0x31);
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                (&local_f8,(jessilib *)&local_108,
                 (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_118,in_R8);
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_f8,2);
      local_119 = 0;
      parameters_local._M_str = (char *)pRVar2;
      std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      if (IRCCommand::active_server == 0) {
        IRCCommand::active_server = IRCCommand::selected_server;
      }
      pRVar2 = (ResponseLine *)operator_new(0x30);
      local_170 = (basic_string_view<char,_std::char_traits<char>_>)
                  Jupiter::IRC::Client::getConfigSection();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_160,&local_170,&local_171);
      s_abi_cxx11_(&local_198," is now selected.",0x11);
      std::operator+(&local_140,&local_160,&local_198);
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_140,0);
      parameters_local._M_str = (char *)pRVar2;
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_171);
    }
  }
  return (ResponseLine *)parameters_local._M_str;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *SelectGenericCommand::trigger(std::string_view parameters)
{
	if (parameters.empty())
	{
		if (IRCCommand::selected_server == nullptr)
			return new Jupiter::GenericCommand::ResponseLine("No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicSuccess);
		return new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " is currently selected."s, GenericCommand::DisplayType::PublicSuccess);
	}
	if (IRCCommand::active_server == IRCCommand::selected_server)
		IRCCommand::active_server = nullptr;

	IRCCommand::selected_server = serverManager->getServer(parameters);
	if (IRCCommand::selected_server == nullptr)
		return new Jupiter::GenericCommand::ResponseLine(jessilib::join<std::string>("Error: IRC server \""sv, parameters, "\" not found. No IRC server is currently selected."sv), GenericCommand::DisplayType::PublicError);

	if (IRCCommand::active_server == nullptr)
		IRCCommand::active_server = IRCCommand::selected_server;
	return new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " is now selected."s, GenericCommand::DisplayType::PublicSuccess);
}